

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

void ncnn::binary_op_broadcast<ncnn::binary_op_add>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *plVar1;
  long *plVar2;
  int *piVar3;
  float *pfVar4;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar5;
  int x_2;
  float *ptr1_2;
  float *ptr_2;
  int y_1;
  int z;
  int binc_2;
  int ainc_2;
  float *outptr_2;
  int q;
  int x_1;
  int binc_1;
  int ainc_1;
  float *outptr_1;
  float *ptr1_1;
  float *ptr_1;
  int y;
  int x;
  int binc;
  int ainc;
  float *outptr;
  float *ptr1;
  float *ptr;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  binary_op_add op;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  void *local_608;
  int *local_600;
  ulong local_5f8;
  undefined4 local_5f0;
  long *local_5e8;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  ulong local_5c8;
  void *local_5c0;
  int *local_5b8;
  ulong local_5b0;
  undefined4 local_5a8;
  long *local_5a0;
  undefined4 local_598;
  int local_594;
  int local_590;
  undefined4 local_58c;
  undefined4 local_588;
  long local_580;
  float *local_578;
  int local_56c;
  int local_568;
  int local_564;
  void *local_560;
  int *local_558;
  ulong local_550;
  undefined4 local_548;
  long *local_540;
  int local_538;
  int local_534;
  int local_530;
  undefined4 local_52c;
  undefined4 local_528;
  ulong local_520;
  void *local_518;
  int *local_510;
  ulong local_508;
  undefined4 local_500;
  long *local_4f8;
  undefined4 local_4f0;
  int local_4ec;
  int local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  long local_4d8;
  float *local_4d0;
  int local_4c4;
  int local_4c0;
  uint local_4bc;
  uint local_4b8;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined8 local_468;
  long local_460;
  int local_458;
  int local_454;
  uint local_450;
  uint local_44c;
  long local_448;
  int local_43c;
  float *local_438;
  int local_42c;
  float *local_428;
  int local_420;
  int local_41c;
  uint local_418;
  uint local_414;
  long local_410;
  float *local_408;
  float *local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  binary_op_add local_3e1 [9];
  long *local_3d8;
  long *local_3d0;
  long *local_3c8;
  undefined8 *local_3c0;
  void **local_3b0;
  void **local_3a0;
  void **local_390;
  void **local_380;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  int local_300;
  undefined4 local_2fc;
  void **local_2f8;
  undefined8 *local_2d8;
  void *local_2c0;
  void *local_2b0;
  void *local_2a0;
  void *local_290;
  undefined8 *local_270;
  int local_25c;
  void **local_258;
  int local_24c;
  void **local_248;
  int local_23c;
  long *local_238;
  int local_22c;
  long *local_228;
  int local_21c;
  long *local_218;
  undefined1 local_20d;
  int local_20c;
  undefined8 *local_200;
  undefined1 local_1d5;
  int local_1d4;
  void **local_1c8;
  undefined1 local_19d;
  int local_19c;
  void **local_190;
  int local_164;
  void **local_160;
  void **local_158;
  int local_14c;
  void **local_148;
  void **local_140;
  long *local_138;
  undefined4 local_12c;
  ulong local_128;
  void *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  void **local_108;
  long *local_100;
  undefined4 local_f4;
  ulong local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  void **local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  long local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long *local_60;
  undefined4 local_54;
  ulong local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  long *local_30;
  undefined4 local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_3e8 = (int)in_RDX[5];
  local_3ec = *(int *)((long)in_RDX + 0x2c);
  local_3f0 = (int)in_RDX[6];
  local_3f4 = *(int *)((long)in_RDX + 0x34);
  local_3f8 = (int)in_RDX[7];
  local_3d8 = in_RDX;
  local_3d0 = in_RSI;
  local_3c8 = in_RDI;
  if (local_3e8 == 1) {
    local_400 = (float *)*in_RDI;
    local_408 = (float *)*in_RSI;
    local_410 = *in_RDX;
    local_414 = (uint)(1 < *(int *)((long)in_RDI + 0x2c));
    local_418 = (uint)(1 < *(int *)((long)in_RSI + 0x2c));
    for (local_41c = 0; local_41c < local_3ec; local_41c = local_41c + 1) {
      fVar5 = binary_op_add::operator()(local_3e1,local_400,local_408);
      *(float *)(local_410 + (long)local_41c * 4) = fVar5;
      local_400 = local_400 + (int)local_414;
      local_408 = local_408 + (int)local_418;
    }
  }
  if (local_3e8 == 2) {
    for (local_420 = 0; plVar2 = local_3c8, local_420 < local_3f0; local_420 = local_420 + 1) {
      local_42c = (int)local_3c8[6] + -1;
      piVar3 = std::min<int>(&local_420,&local_42c);
      plVar1 = local_3d0;
      local_22c = *piVar3;
      local_228 = plVar2;
      local_428 = (float *)(*plVar2 +
                           (long)*(int *)((long)plVar2 + 0x2c) * (long)local_22c * plVar2[2]);
      local_43c = (int)local_3d0[6] + -1;
      piVar3 = std::min<int>(&local_420,&local_43c);
      local_23c = *piVar3;
      local_238 = plVar1;
      local_438 = (float *)(*plVar1 +
                           (long)*(int *)((long)plVar1 + 0x2c) * (long)local_23c * plVar1[2]);
      local_218 = local_3d8;
      local_21c = local_420;
      local_448 = *local_3d8 +
                  (long)*(int *)((long)local_3d8 + 0x2c) * (long)local_420 * local_3d8[2];
      local_44c = (uint)(1 < *(int *)((long)local_3c8 + 0x2c));
      local_450 = (uint)(1 < *(int *)((long)local_3d0 + 0x2c));
      for (local_454 = 0; local_454 < local_3ec; local_454 = local_454 + 1) {
        fVar5 = binary_op_add::operator()(local_3e1,local_428,local_438);
        *(float *)(local_448 + (long)local_454 * 4) = fVar5;
        local_428 = local_428 + (int)local_44c;
        local_438 = local_438 + (int)local_450;
      }
    }
  }
  if ((local_3e8 == 3) || (local_3e8 == 4)) {
    for (local_458 = 0; local_458 < local_3f8; local_458 = local_458 + 1) {
      local_200 = &local_4a8;
      local_9c = *(int *)((long)local_3d8 + 0x2c);
      local_a0 = (int)local_3d8[6];
      local_a4 = *(undefined4 *)((long)local_3d8 + 0x34);
      local_460 = *local_3d8 + local_3d8[8] * (long)local_458 * local_3d8[2];
      local_b8 = local_3d8[2];
      local_bc = (undefined4)local_3d8[3];
      local_c8 = local_3d8[4];
      local_98 = &local_4a8;
      local_88 = (long)local_9c * (long)local_a0 * local_b8;
      local_270 = &local_4a8;
      local_3c0 = &local_4a8;
      local_8c = 0x10;
      local_20c = local_458;
      local_20d = 1;
      local_4a8 = 0;
      local_498 = 0;
      local_490 = 0;
      local_480 = 0;
      local_47c = 0;
      local_478 = 0;
      local_474 = 0;
      local_470 = 0;
      local_468 = 0;
      local_4a0 = 0;
      local_4b8 = (uint)(1 < *(int *)((long)local_3c8 + 0x2c));
      local_4bc = (uint)(1 < *(int *)((long)local_3d0 + 0x2c));
      local_2d8 = local_3c0;
      local_b0 = local_460;
      local_488 = local_c8;
      for (local_4c0 = 0; local_4c0 < local_3f4; local_4c0 = local_4c0 + 1) {
        for (local_4c4 = 0; plVar2 = local_3c8, local_4c4 < local_3f0; local_4c4 = local_4c4 + 1) {
          local_564 = (int)local_3c8[7] + -1;
          piVar3 = std::min<int>(&local_458,&local_564);
          local_19c = *piVar3;
          local_190 = &local_560;
          local_10c = *(int *)((long)plVar2 + 0x2c);
          local_110 = (int)plVar2[6];
          local_114 = *(undefined4 *)((long)plVar2 + 0x34);
          local_120 = (void *)(*plVar2 + plVar2[8] * (long)local_19c * plVar2[2]);
          local_128 = plVar2[2];
          local_12c = (undefined4)plVar2[3];
          local_138 = (long *)plVar2[4];
          local_108 = &local_560;
          local_558 = (int *)0x0;
          local_52c = 1;
          local_68 = (long)local_10c * (long)local_110 * local_128;
          local_520 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_128;
          local_538 = (int)plVar2[5] + -1;
          if ((int)plVar2[5] == 4) {
            local_520 = (long)*(int *)((long)plVar2 + 0x2c) * (long)(int)plVar2[6];
          }
          local_6c = 0x10;
          local_19d = 1;
          local_568 = *(int *)((long)local_3c8 + 0x34) + -1;
          local_560 = local_120;
          local_550 = local_128;
          local_548 = local_12c;
          local_540 = local_138;
          local_534 = local_10c;
          local_530 = local_110;
          local_528 = local_114;
          piVar3 = std::min<int>(&local_4c0,&local_568);
          local_14c = *piVar3;
          local_140 = &local_518;
          local_148 = &local_560;
          local_3c = local_534;
          local_40 = local_530;
          local_48 = (void *)((long)local_560 +
                             (long)local_534 * (long)local_530 * (long)local_14c * local_550);
          local_50 = local_550;
          local_54 = local_548;
          local_60 = local_540;
          local_38 = &local_518;
          local_510 = (int *)0x0;
          local_508 = local_550;
          local_500 = local_548;
          local_4f8 = local_540;
          local_4f0 = 2;
          local_4ec = local_534;
          local_4e8 = local_530;
          local_4e4 = 1;
          local_4e0 = 1;
          local_4d8 = (long)local_534 * (long)local_530;
          local_56c = (int)local_3c8[6] + -1;
          local_518 = local_48;
          piVar3 = std::min<int>(&local_4c4,&local_56c);
          local_24c = *piVar3;
          local_248 = &local_518;
          pfVar4 = (float *)((long)local_518 + (long)local_4ec * (long)local_24c * local_508);
          local_3b0 = &local_518;
          local_2f8 = local_3b0;
          if (local_510 != (int *)0x0) {
            local_2fc = 0xffffffff;
            LOCK();
            local_300 = *local_510;
            *local_510 = *local_510 + -1;
            UNLOCK();
            if (local_300 == 1) {
              if (local_4f8 == (long *)0x0) {
                local_2c0 = local_518;
                if (local_518 != (void *)0x0) {
                  free(local_518);
                }
              }
              else {
                (**(code **)(*local_4f8 + 0x18))(local_4f8,local_518);
              }
            }
          }
          local_518 = (void *)0x0;
          local_508 = 0;
          local_500 = 0;
          local_4f0 = 0;
          local_4ec = 0;
          local_4e8 = 0;
          local_4e4 = 0;
          local_4e0 = 0;
          local_4d8 = 0;
          local_510 = (int *)0x0;
          local_3a0 = &local_560;
          local_318 = local_3a0;
          if (local_558 != (int *)0x0) {
            local_31c = 0xffffffff;
            LOCK();
            local_320 = *local_558;
            *local_558 = *local_558 + -1;
            UNLOCK();
            if (local_320 == 1) {
              if (local_540 == (long *)0x0) {
                local_2b0 = local_560;
                if (local_560 != (void *)0x0) {
                  free(local_560);
                }
              }
              else {
                (**(code **)(*local_540 + 0x18))(local_540,local_560);
              }
            }
          }
          plVar2 = local_3d0;
          local_560 = (void *)0x0;
          local_550 = 0;
          local_548 = 0;
          local_538 = 0;
          local_534 = 0;
          local_530 = 0;
          local_52c = 0;
          local_528 = 0;
          local_520 = 0;
          local_558 = (int *)0x0;
          local_60c = (int)local_3d0[7] + -1;
          local_4d0 = pfVar4;
          piVar3 = std::min<int>(&local_458,&local_60c);
          local_1d4 = *piVar3;
          local_1c8 = &local_608;
          local_d4 = *(int *)((long)plVar2 + 0x2c);
          local_d8 = (int)plVar2[6];
          local_dc = *(undefined4 *)((long)plVar2 + 0x34);
          local_e8 = (void *)(*plVar2 + plVar2[8] * (long)local_1d4 * plVar2[2]);
          local_f0 = plVar2[2];
          local_f4 = (undefined4)plVar2[3];
          local_100 = (long *)plVar2[4];
          local_d0 = &local_608;
          local_600 = (int *)0x0;
          local_5d4 = 1;
          local_78 = (long)local_d4 * (long)local_d8 * local_f0;
          local_5c8 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_f0;
          local_5e0 = (int)plVar2[5] + -1;
          if ((int)plVar2[5] == 4) {
            local_5c8 = (long)*(int *)((long)plVar2 + 0x2c) * (long)(int)plVar2[6];
          }
          local_7c = 0x10;
          local_1d5 = 1;
          local_610 = *(int *)((long)local_3d0 + 0x34) + -1;
          local_608 = local_e8;
          local_5f8 = local_f0;
          local_5f0 = local_f4;
          local_5e8 = local_100;
          local_5dc = local_d4;
          local_5d8 = local_d8;
          local_5d0 = local_dc;
          piVar3 = std::min<int>(&local_4c0,&local_610);
          local_164 = *piVar3;
          local_158 = &local_5c0;
          local_160 = &local_608;
          local_c = local_5dc;
          local_10 = local_5d8;
          local_18 = (void *)((long)local_608 +
                             (long)local_5dc * (long)local_5d8 * (long)local_164 * local_5f8);
          local_20 = local_5f8;
          local_24 = local_5f0;
          local_30 = local_5e8;
          local_8 = &local_5c0;
          local_5b8 = (int *)0x0;
          local_5b0 = local_5f8;
          local_5a8 = local_5f0;
          local_5a0 = local_5e8;
          local_598 = 2;
          local_594 = local_5dc;
          local_590 = local_5d8;
          local_58c = 1;
          local_588 = 1;
          local_580 = (long)local_5dc * (long)local_5d8;
          local_614 = (int)local_3d0[6] + -1;
          local_5c0 = local_18;
          piVar3 = std::min<int>(&local_4c4,&local_614);
          local_25c = *piVar3;
          local_258 = &local_5c0;
          pfVar4 = (float *)((long)local_5c0 + (long)local_594 * (long)local_25c * local_5b0);
          local_390 = &local_5c0;
          local_338 = local_390;
          if (local_5b8 != (int *)0x0) {
            local_33c = 0xffffffff;
            LOCK();
            local_340 = *local_5b8;
            *local_5b8 = *local_5b8 + -1;
            UNLOCK();
            if (local_340 == 1) {
              if (local_5a0 == (long *)0x0) {
                local_2a0 = local_5c0;
                if (local_5c0 != (void *)0x0) {
                  free(local_5c0);
                }
              }
              else {
                (**(code **)(*local_5a0 + 0x18))(local_5a0,local_5c0);
              }
            }
          }
          local_5c0 = (void *)0x0;
          local_5b0 = 0;
          local_5a8 = 0;
          local_598 = 0;
          local_594 = 0;
          local_590 = 0;
          local_58c = 0;
          local_588 = 0;
          local_580 = 0;
          local_5b8 = (int *)0x0;
          local_380 = &local_608;
          local_358 = local_380;
          if (local_600 != (int *)0x0) {
            local_35c = 0xffffffff;
            LOCK();
            local_360 = *local_600;
            *local_600 = *local_600 + -1;
            UNLOCK();
            if (local_360 == 1) {
              if (local_5e8 == (long *)0x0) {
                local_290 = local_608;
                if (local_608 != (void *)0x0) {
                  free(local_608);
                }
              }
              else {
                (**(code **)(*local_5e8 + 0x18))(local_5e8,local_608);
              }
            }
          }
          local_608 = (void *)0x0;
          local_5f8 = 0;
          local_5f0 = 0;
          local_5e0 = 0;
          local_5dc = 0;
          local_5d8 = 0;
          local_5d4 = 0;
          local_5d0 = 0;
          local_5c8 = 0;
          local_600 = (int *)0x0;
          local_578 = pfVar4;
          for (local_618 = 0; local_618 < local_3ec; local_618 = local_618 + 1) {
            fVar5 = binary_op_add::operator()(local_3e1,local_4d0,local_578);
            *(float *)(local_460 + (long)local_618 * 4) = fVar5;
            local_4d0 = local_4d0 + (int)local_4b8;
            local_578 = local_578 + (int)local_4bc;
          }
          local_460 = local_460 + (long)local_3ec * 4;
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}